

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiContext *g;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar21 [64];
  double dVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float zero_deadzone_halfsize;
  float fVar25;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  pIVar6 = GImGui;
  auVar21._8_56_ = in_register_00001248;
  auVar21._0_8_ = v_max;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = v_min;
  uVar10 = flags & 0x100000;
  uVar3 = vcmpsd_avx512f(auVar19._0_16_,auVar21._0_16_,1);
  bVar8 = (bool)((byte)uVar3 & 1);
  uVar9 = data_type & 0xfffffffe;
  fVar17 = *(float *)((long)&(bb->Max).x + (ulong)(uVar10 >> 0x12));
  fVar25 = *(float *)((long)&(bb->Min).x + (ulong)(uVar10 >> 0x12));
  fVar12 = (GImGui->Style).GrabMinSize;
  auVar23 = ZEXT416((uint)fVar12);
  fVar2 = (fVar17 - fVar25) + -4.0;
  local_48._0_8_ = (ulong)bVar8 * (long)(v_max - v_min) + (ulong)!bVar8 * (long)(v_min - v_max);
  local_48._8_8_ = 0;
  if ((uVar9 != 8) && (0.0 <= (double)local_48._0_8_)) {
    dVar22 = (double)fVar2 / ((double)local_48._0_8_ + 1.0);
    auVar23._0_4_ = (float)dVar22;
    auVar23._4_4_ = (int)((ulong)dVar22 >> 0x20);
    auVar23._8_8_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar12),auVar23,2);
    bVar8 = (bool)((byte)uVar3 & 1);
    auVar23 = ZEXT416((uint)bVar8 * (int)auVar23._0_4_ + (uint)!bVar8 * (int)fVar12);
  }
  auVar23 = vminss_avx(auVar23,ZEXT416((uint)fVar2));
  zero_deadzone_halfsize = 0.0;
  fVar15 = 0.0;
  fVar12 = fVar2 - auVar23._0_4_;
  if ((flags & 0x20U) != 0) {
    if (uVar9 == 8) {
      iVar7 = ImParseFormatPrecision(format,3);
      fVar15 = (float)iVar7;
    }
    else {
      fVar15 = 1.0;
    }
    fVar15 = powf(0.1,fVar15);
    auVar13 = vmaxss_avx(ZEXT416((uint)fVar12),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar6->Style).LogSliderDeadzone * 0.5) / auVar13._0_4_;
  }
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 + 2.0)),auVar23,SUB6416(ZEXT464(0x3f000000),0));
  fVar25 = auVar13._0_4_;
  if (pIVar6->ActiveId == id) {
    if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar6->ActiveIdIsJustActivated == true) {
        pIVar6->SliderCurrentAccum = 0.0;
        pIVar6->SliderCurrentAccumDirty = false;
      }
      auVar20._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar20._8_56_ = extraout_var;
      auVar13 = vmovshdup_avx(auVar20._0_16_);
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(auVar13,auVar14);
      auVar13._0_4_ =
           (float)((uint)(uVar10 == 0) * (int)auVar20._0_4_ + (uint)(uVar10 != 0) * auVar13._0_4_);
      if ((auVar13._0_4_ != 0.0) || (NAN(auVar13._0_4_))) {
        if ((uVar9 == 8) && (iVar7 = ImParseFormatPrecision(format,3), 0 < iVar7)) {
          uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          bVar8 = (bool)((byte)uVar3 & 1);
          fVar12 = (float)((uint)bVar8 * (int)((auVar13._0_4_ / 100.0) / 10.0) +
                          (uint)!bVar8 * (int)(auVar13._0_4_ / 100.0));
        }
        else {
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0x7fffffffffffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar14 = vandpd_avx512vl(local_48,auVar5);
          if ((auVar14._0_8_ <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            uVar3 = vcmpss_avx512f(auVar13,ZEXT816(0) << 0x40,1);
            bVar8 = (bool)((byte)uVar3 & 1);
            fVar12 = (float)((uint)bVar8 * -0x40800000 + (uint)!bVar8 * 0x3f800000) /
                     (float)(double)local_48._0_8_;
          }
          else {
            fVar12 = auVar13._0_4_ / 100.0;
          }
        }
        uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        bVar8 = (bool)((byte)uVar3 & 1);
        fVar24 = (float)((uint)bVar8 * (int)(fVar12 * 10.0) + (uint)!bVar8 * (int)fVar12) +
                 pIVar6->SliderCurrentAccum;
        pIVar6->SliderCurrentAccum = fVar24;
        pIVar6->SliderCurrentAccumDirty = true;
      }
      else {
        fVar24 = pIVar6->SliderCurrentAccum;
      }
      if ((pIVar6->NavActivatePressedId == id) && (pIVar6->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar6->SliderCurrentAccumDirty == true) {
        bVar8 = SUB41((flags & 0x20U) >> 5,0);
        fVar16 = ScaleRatioFromValueT<double,double,double>
                           (data_type,*v,v_min,v_max,bVar8,fVar15,zero_deadzone_halfsize);
        if (((fVar16 < 1.0) || (fVar24 <= 0.0)) && ((0.0 < fVar16 || (0.0 <= fVar24)))) {
          uVar3 = vcmpss_avx512f(ZEXT416((uint)(fVar24 + fVar16)),ZEXT816(0) << 0x40,1);
          auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar24 + fVar16)));
          fVar12 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar13._0_4_);
          dVar22 = ScaleValueFromRatioT<double,double,double>
                             (data_type,fVar12,v_min,v_max,bVar8,fVar15,zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            dVar22 = RoundScalarWithFormatT<double,double>(format,data_type,dVar22);
          }
          fVar18 = ScaleRatioFromValueT<double,double,double>
                             (data_type,dVar22,v_min,v_max,bVar8,fVar15,zero_deadzone_halfsize);
          fVar18 = fVar18 - fVar16;
          bVar8 = fVar24 <= fVar18;
          if (0.0 < fVar24) {
            bVar8 = fVar18 < fVar24;
          }
          pIVar6->SliderCurrentAccum =
               pIVar6->SliderCurrentAccum -
               (float)((uint)bVar8 * (int)fVar18 + (uint)!bVar8 * (int)fVar24);
          pIVar6->SliderCurrentAccumDirty = false;
          goto LAB_002985a6;
        }
        pIVar6->SliderCurrentAccum = 0.0;
        pIVar6->SliderCurrentAccumDirty = false;
      }
    }
    else if (pIVar6->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar6->IO).MouseDown[0] == false) {
        ClearActiveID();
      }
      else {
        fVar24 = 0.0;
        if (0.0 < fVar12) {
          auVar14 = ZEXT416((uint)((*(float *)((pIVar6->IO).MouseDown +
                                              (ulong)(uVar10 >> 0x14) * 4 + -8) - fVar25) / fVar12))
          ;
          auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
          uVar3 = vcmpss_avx512f(auVar14,ZEXT816(0),1);
          fVar24 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar13._0_4_);
        }
        fVar12 = (float)((uint)(uVar10 == 0) * (int)fVar24 +
                        (uint)(uVar10 != 0) * (int)(1.0 - fVar24));
LAB_002985a6:
        dVar22 = ScaleValueFromRatioT<double,double,double>
                           (data_type,fVar12,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar15,
                            zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          dVar22 = RoundScalarWithFormatT<double,double>(format,data_type,dVar22);
        }
        if ((*v != dVar22) || (NAN(*v) || NAN(dVar22))) {
          bVar8 = true;
          *v = dVar22;
          goto LAB_0029894f;
        }
      }
      bVar8 = false;
      goto LAB_0029894f;
    }
  }
  bVar8 = false;
LAB_0029894f:
  if (1.0 <= fVar2) {
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(auVar23,auVar4);
    auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(fVar17 + -2.0)),auVar23,SUB6416(ZEXT464(0x3f000000),0)
                              );
    fVar17 = ScaleRatioFromValueT<double,double,double>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar15,
                        zero_deadzone_halfsize);
    bVar11 = uVar10 == 0;
    auVar13 = vfmadd213ss_fma(ZEXT416((uint)(auVar13._0_4_ - fVar25)),
                              ZEXT416((uint)bVar11 * (int)fVar17 +
                                      (uint)!bVar11 * (int)(1.0 - fVar17)),ZEXT416((uint)fVar25));
    if (bVar11) {
      fVar17 = (bb->Min).y;
      fVar25 = (bb->Max).y;
      auVar14 = vfmadd213ss_fma(auVar14,SUB6416(ZEXT464(0x3f000000),0),auVar13);
      auVar23 = vfmadd213ss_fma(auVar23,SUB6416(ZEXT464(0x3f000000),0),auVar13);
      (out_grab_bb->Min).x = auVar14._0_4_;
      (out_grab_bb->Min).y = fVar17 + 2.0;
      (out_grab_bb->Max).x = auVar23._0_4_;
      (out_grab_bb->Max).y = fVar25 + -2.0;
    }
    else {
      fVar17 = (bb->Max).x;
      auVar14 = vfmadd213ss_fma(auVar14,SUB6416(ZEXT464(0x3f000000),0),auVar13);
      auVar23 = vfmadd213ss_fma(auVar23,SUB6416(ZEXT464(0x3f000000),0),auVar13);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar14._0_4_;
      (out_grab_bb->Max).x = fVar17 + -2.0;
      (out_grab_bb->Max).y = auVar23._0_4_;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar8;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}